

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  allocator local_51;
  string local_50;
  Emulator emu;
  
  if (argc < 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"USAGE: ");
    poVar2 = std::operator<<(poVar2,*argv);
    poVar2 = std::operator<<(poVar2," filename.nes");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = 1;
  }
  else {
    std::__cxx11::string::string((string *)&local_50,argv[1],&local_51);
    Emulator::Emulator(&emu,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    iVar1 = Emulator::run(&emu);
    Emulator::~Emulator(&emu);
  }
  return iVar1;
}

Assistant:

int main(int argc, char *argv[]) {
#ifndef __EMSCRIPTEN__
    if (argc < 2) {
        std::cout << "USAGE: " << argv[0] << " filename.nes" << std::endl;
        return 1;
    }
    Emulator emu(argv[1]);
#else
    Emulator emu("game.nes");
#endif
    int ret = emu.run();
    return ret;
}